

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyAddOneSegment
               (GeoOverlap *p,GeoCoord x0,GeoCoord y0,GeoCoord x1,GeoCoord y1,uchar side,uint idx)

{
  GeoSegment *pGVar1;
  GeoEvent *pGVar2;
  GeoCoord t;
  GeoEvent *pEvent;
  GeoSegment *pSeg;
  uint idx_local;
  uchar side_local;
  GeoCoord y1_local;
  GeoCoord x1_local;
  GeoCoord y0_local;
  GeoCoord x0_local;
  GeoOverlap *p_local;
  
  if ((x0 != x1) || (NAN(x0) || NAN(x1))) {
    y1_local = y1;
    x1_local = x1;
    y0_local = y0;
    x0_local = x0;
    if (x1 < x0) {
      y1_local = y0;
      x1_local = x0;
      y0_local = y1;
      x0_local = x1;
    }
    pGVar1 = p->aSegment + p->nSegment;
    p->nSegment = p->nSegment + 1;
    pGVar1->C = (double)((y1_local - y0_local) / (x1_local - x0_local));
    pGVar1->B = -(double)x1_local * pGVar1->C + (double)y1_local;
    pGVar1->y0 = y0_local;
    pGVar1->side = side;
    pGVar1->idx = idx;
    pGVar2 = p->aEvent + p->nEvent;
    p->nEvent = p->nEvent + 1;
    pGVar2->x = (double)x0_local;
    pGVar2->eType = 0;
    pGVar2->pSeg = pGVar1;
    pGVar2 = p->aEvent + p->nEvent;
    p->nEvent = p->nEvent + 1;
    pGVar2->x = (double)x1_local;
    pGVar2->eType = 1;
    pGVar2->pSeg = pGVar1;
  }
  return;
}

Assistant:

static void geopolyAddOneSegment(
  GeoOverlap *p,
  GeoCoord x0,
  GeoCoord y0,
  GeoCoord x1,
  GeoCoord y1,
  unsigned char side,
  unsigned int idx
){
  GeoSegment *pSeg;
  GeoEvent *pEvent;
  if( x0==x1 ) return;  /* Ignore vertical segments */
  if( x0>x1 ){
    GeoCoord t = x0;
    x0 = x1;
    x1 = t;
    t = y0;
    y0 = y1;
    y1 = t;
  }
  pSeg = p->aSegment + p->nSegment;
  p->nSegment++;
  pSeg->C = (y1-y0)/(x1-x0);
  pSeg->B = y1 - x1*pSeg->C;
  pSeg->y0 = y0;
  pSeg->side = side;
  pSeg->idx = idx;
  pEvent = p->aEvent + p->nEvent;
  p->nEvent++;
  pEvent->x = x0;
  pEvent->eType = 0;
  pEvent->pSeg = pSeg;
  pEvent = p->aEvent + p->nEvent;
  p->nEvent++;
  pEvent->x = x1;
  pEvent->eType = 1;
  pEvent->pSeg = pSeg;
}